

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O1

void soplex::LPFwriteSVector
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *p_svec,SPxOut *spxout,bool writeZeroCoefficients)

{
  bool bVar1;
  SPxOut *pSVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  undefined3 in_register_00000089;
  int i;
  type t;
  Rational coeff;
  char name [16];
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_120;
  data_type local_118;
  char local_103;
  char local_102;
  uint local_f8;
  void *local_f0;
  char local_e3;
  char local_e2;
  SPxOut *local_d0;
  long local_c8;
  undefined4 local_bc;
  NameSet *local_b8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_b0;
  uint local_a8 [2];
  void *local_a0;
  char local_93;
  char local_92;
  uint local_88;
  void *local_80;
  char local_73;
  char local_72;
  string local_68;
  char local_48 [24];
  
  local_bc = CONCAT31(in_register_00000089,writeZeroCoefficients);
  local_d0 = spxout;
  local_b8 = p_cnames;
  local_b0 = p_svec;
  local_c8 = std::ostream::tellp();
  if (0 < (p_lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .set.thenum) {
    i = 0;
    iVar8 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)local_a8,local_b0,i);
      local_120.arg = (type)0x0;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)&local_118.ld,(longlong *)&local_120,(type *)0x0);
      iVar3 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)local_a8,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)&local_118.ld);
      if ((local_e3 == '\0') && (local_e2 == '\0')) {
        operator_delete(local_f0,(ulong)local_f8 << 3);
      }
      if ((local_103 == '\0') && (local_102 == '\0')) {
        operator_delete(local_118.ld.data,(ulong)local_118.ld.capacity << 3);
      }
      if (iVar3 != 0 || (char)local_bc != '\0') {
        if (iVar8 == 0) {
          poVar5 = boost::multiprecision::operator<<
                             (p_output,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                        *)local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          pcVar6 = getColName(p_lp,i,local_b8,local_48);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          iVar8 = 0;
        }
        else {
          bVar1 = true;
          if (iVar8 != 5) {
            lVar4 = std::ostream::tellp();
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_68,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)local_a8,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            bVar1 = 0x10000 < (long)(local_68._M_string_length + (lVar4 - local_c8) + 100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
            lVar4 = std::ostream::tellp();
            pSVar2 = local_d0;
            if (((local_d0 != (SPxOut *)0x0) && (0x10000 < lVar4 - local_c8)) &&
               (0 < (int)local_d0->m_verbosity)) {
              local_120.arg._0_4_ = 1;
              local_118.ld.capacity = local_d0->m_verbosity;
              (*local_d0->_vptr_SPxOut[2])(local_d0,&local_120);
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar2->m_streams[pSVar2->m_verbosity],
                         "XLPSWR01 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
                         ,0x53);
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_118);
            }
            local_c8 = std::ostream::tellp();
            iVar8 = 0;
          }
          local_120.arg = (type)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_118.ld,(longlong *)&local_120,(type *)0x0);
          iVar3 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)local_a8,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_118.ld);
          if ((local_e3 == '\0') && (local_e2 == '\0')) {
            operator_delete(local_f0,(ulong)local_f8 << 3);
          }
          if ((local_103 == '\0') && (local_102 == '\0')) {
            operator_delete(local_118.ld.data,(ulong)local_118.ld.capacity << 3);
          }
          if (iVar3 < 0) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            local_120.arg = (type)local_a8;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_118.ld,&local_120,(type *)0x0);
            boost::multiprecision::operator<<
                      (p_output,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)&local_118.ld);
            if ((local_e3 == '\0') && (local_e2 == '\0')) {
              operator_delete(local_f0,(ulong)local_f8 << 3);
            }
            if ((local_103 == '\0') && (local_102 == '\0')) {
              operator_delete(local_118.ld.data,(ulong)local_118.ld.capacity << 3);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
            boost::multiprecision::operator<<
                      (p_output,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)local_a8);
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          pcVar6 = getColName(p_lp,i,local_b8,local_48);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)p_output + -0x18) + (int)p_output);
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar6,sVar7);
          }
        }
        iVar8 = iVar8 + 1;
      }
      if ((local_73 == '\0') && (local_72 == '\0')) {
        operator_delete(local_80,(ulong)local_88 << 3);
      }
      if ((local_93 == '\0') && (local_92 == '\0')) {
        operator_delete(local_a0,(ulong)local_a8[0] << 3);
      }
      i = i + 1;
    } while (i < (p_lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 .set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<Rational>&   p_lp,                         ///< the LP
   std::ostream&                p_output,                     ///< output stream
   const NameSet*               p_cnames,                     ///< column names
   const SVectorBase<Rational>& p_svec,                       ///< vector to write
   SPxOut*                      spxout,                       ///< out stream
   const bool                   writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;
   long long pos;

   pos = p_output.tellp();

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const Rational coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns or whenever max line length is nearly exceeded
         if(num_coeffs == SOPLEX_NUM_ENTRIES_PER_LINE ||
               (long long)(p_output.tellp()) - pos + (long long)(coeff.str().length() + 100) >
               SOPLEX_MAX_LINE_WRITE_LEN)
         {
            num_coeffs = 0;
            p_output << "\n\t";

            if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
            {
               SPX_MSG_WARNING((*spxout), (*spxout) <<
                               "XLPSWR01 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
            }

            pos = p_output.tellp();
         }

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}